

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

ShaderEvalFunc
deqp::gles2::Functional::MatrixCaseUtils::getEvalFunc(ShaderInput *in0,ShaderInput *in1,MatrixOp op)

{
  DataType DVar1;
  
  DVar1 = in0->dataType << 9 | op << 0x12 | (uint)(in0->inputType == INPUTTYPE_DYNAMIC) << 0x11 |
          (uint)(in1->inputType == INPUTTYPE_DYNAMIC) << 8 | in1->dataType;
  if ((int)DVar1 < 0xe1a01) {
    if ((int)DVar1 < 0x80b02) {
      if ((int)DVar1 < 0x41301) {
        if ((int)DVar1 < 0x20b01) {
          if ((int)DVar1 < 0x1301) {
            if ((int)DVar1 < 0xb01) {
              if (DVar1 == 0xa01) {
                return Evaluator<0,_0,_5,_0,_1>::evaluate;
              }
              if (DVar1 == 0xa05) {
                return Evaluator<0,_0,_5,_0,_5>::evaluate;
              }
            }
            else {
              if (DVar1 == 0xb01) {
                return Evaluator<0,_0,_5,_2,_1>::evaluate;
              }
              if (DVar1 == 0x1201) {
                return Evaluator<0,_0,_9,_0,_1>::evaluate;
              }
              if (DVar1 == 0x1209) {
                return Evaluator<0,_0,_9,_0,_9>::evaluate;
              }
            }
          }
          else if ((int)DVar1 < 0x1b01) {
            if (DVar1 == 0x1301) {
              return Evaluator<0,_0,_9,_2,_1>::evaluate;
            }
            if (DVar1 == 0x1a01) {
              return Evaluator<0,_0,_13,_0,_1>::evaluate;
            }
            if (DVar1 == 0x1a0d) {
              return Evaluator<0,_0,_13,_0,_13>::evaluate;
            }
          }
          else {
            if (DVar1 == 0x1b01) {
              return Evaluator<0,_0,_13,_2,_1>::evaluate;
            }
            if (DVar1 == 0x20a01) {
              return Evaluator<0,_2,_5,_0,_1>::evaluate;
            }
            if (DVar1 == 0x20a05) {
              return Evaluator<0,_2,_5,_0,_5>::evaluate;
            }
          }
        }
        else if ((int)DVar1 < 0x21b01) {
          if ((int)DVar1 < 0x21301) {
            if (DVar1 == 0x20b01) {
              return Evaluator<0,_2,_5,_2,_1>::evaluate;
            }
            if (DVar1 == 0x21201) {
              return Evaluator<0,_2,_9,_0,_1>::evaluate;
            }
            if (DVar1 == 0x21209) {
              return Evaluator<0,_2,_9,_0,_9>::evaluate;
            }
          }
          else {
            if (DVar1 == 0x21301) {
              return Evaluator<0,_2,_9,_2,_1>::evaluate;
            }
            if (DVar1 == 0x21a01) {
              return Evaluator<0,_2,_13,_0,_1>::evaluate;
            }
            if (DVar1 == 0x21a0d) {
              return Evaluator<0,_2,_13,_0,_13>::evaluate;
            }
          }
        }
        else if ((int)DVar1 < 0x40b01) {
          if (DVar1 == 0x21b01) {
            return Evaluator<0,_2,_13,_2,_1>::evaluate;
          }
          if (DVar1 == 0x40a01) {
            return Evaluator<1,_0,_5,_0,_1>::evaluate;
          }
          if (DVar1 == 0x40a05) {
            return Evaluator<1,_0,_5,_0,_5>::evaluate;
          }
        }
        else {
          if (DVar1 == 0x40b01) {
            return Evaluator<1,_0,_5,_2,_1>::evaluate;
          }
          if (DVar1 == 0x41201) {
            return Evaluator<1,_0,_9,_0,_1>::evaluate;
          }
          if (DVar1 == 0x41209) {
            return Evaluator<1,_0,_9,_0,_9>::evaluate;
          }
        }
      }
      else if ((int)DVar1 < 0x61a0d) {
        if ((int)DVar1 < 0x60a05) {
          if ((int)DVar1 < 0x41a0d) {
            if (DVar1 == 0x41301) {
              return Evaluator<1,_0,_9,_2,_1>::evaluate;
            }
            if (DVar1 == 0x41a01) {
              return Evaluator<1,_0,_13,_0,_1>::evaluate;
            }
          }
          else {
            if (DVar1 == 0x41a0d) {
              return Evaluator<1,_0,_13,_0,_13>::evaluate;
            }
            if (DVar1 == 0x41b01) {
              return Evaluator<1,_0,_13,_2,_1>::evaluate;
            }
            if (DVar1 == 0x60a01) {
              return Evaluator<1,_2,_5,_0,_1>::evaluate;
            }
          }
        }
        else if ((int)DVar1 < 0x61209) {
          if (DVar1 == 0x60a05) {
            return Evaluator<1,_2,_5,_0,_5>::evaluate;
          }
          if (DVar1 == 0x60b01) {
            return Evaluator<1,_2,_5,_2,_1>::evaluate;
          }
          if (DVar1 == 0x61201) {
            return Evaluator<1,_2,_9,_0,_1>::evaluate;
          }
        }
        else {
          if (DVar1 == 0x61209) {
            return Evaluator<1,_2,_9,_0,_9>::evaluate;
          }
          if (DVar1 == 0x61301) {
            return Evaluator<1,_2,_9,_2,_1>::evaluate;
          }
          if (DVar1 == 0x61a01) {
            return Evaluator<1,_2,_13,_0,_1>::evaluate;
          }
        }
      }
      else if ((int)DVar1 < 0x8080d) {
        if ((int)DVar1 < 0x80505) {
          if (DVar1 == 0x61a0d) {
            return Evaluator<1,_2,_13,_0,_13>::evaluate;
          }
          if (DVar1 == 0x61b01) {
            return Evaluator<1,_2,_13,_2,_1>::evaluate;
          }
          if (DVar1 == 0x80405) {
            return Evaluator<2,_0,_2,_0,_5>::evaluate;
          }
        }
        else {
          if (DVar1 == 0x80505) {
            return Evaluator<2,_0,_2,_2,_5>::evaluate;
          }
          if (DVar1 == 0x80609) {
            return Evaluator<2,_0,_3,_0,_9>::evaluate;
          }
          if (DVar1 == 0x80709) {
            return Evaluator<2,_0,_3,_2,_9>::evaluate;
          }
        }
      }
      else if ((int)DVar1 < 0x80a02) {
        if (DVar1 == 0x8080d) {
          return Evaluator<2,_0,_4,_0,_13>::evaluate;
        }
        if (DVar1 == 0x8090d) {
          return Evaluator<2,_0,_4,_2,_13>::evaluate;
        }
        if (DVar1 == 0x80a01) {
          return Evaluator<2,_0,_5,_0,_1>::evaluate;
        }
      }
      else {
        if (DVar1 == 0x80a02) {
          return Evaluator<2,_0,_5,_0,_2>::evaluate;
        }
        if (DVar1 == 0x80a05) {
          return Evaluator<2,_0,_5,_0,_5>::evaluate;
        }
        if (DVar1 == 0x80b01) {
          return Evaluator<2,_0,_5,_2,_1>::evaluate;
        }
      }
    }
    else if ((int)DVar1 < 0xa1203) {
      if ((int)DVar1 < 0xa0405) {
        if ((int)DVar1 < 0x81303) {
          if ((int)DVar1 < 0x81203) {
            if (DVar1 == 0x80b02) {
              return Evaluator<2,_0,_5,_2,_2>::evaluate;
            }
            if (DVar1 == 0x81201) {
              return Evaluator<2,_0,_9,_0,_1>::evaluate;
            }
          }
          else {
            if (DVar1 == 0x81203) {
              return Evaluator<2,_0,_9,_0,_3>::evaluate;
            }
            if (DVar1 == 0x81209) {
              return Evaluator<2,_0,_9,_0,_9>::evaluate;
            }
            if (DVar1 == 0x81301) {
              return Evaluator<2,_0,_9,_2,_1>::evaluate;
            }
          }
        }
        else if ((int)DVar1 < 0x81a0d) {
          if (DVar1 == 0x81303) {
            return Evaluator<2,_0,_9,_2,_3>::evaluate;
          }
          if (DVar1 == 0x81a01) {
            return Evaluator<2,_0,_13,_0,_1>::evaluate;
          }
          if (DVar1 == 0x81a04) {
            return Evaluator<2,_0,_13,_0,_4>::evaluate;
          }
        }
        else {
          if (DVar1 == 0x81a0d) {
            return Evaluator<2,_0,_13,_0,_13>::evaluate;
          }
          if (DVar1 == 0x81b01) {
            return Evaluator<2,_0,_13,_2,_1>::evaluate;
          }
          if (DVar1 == 0x81b04) {
            return Evaluator<2,_0,_13,_2,_4>::evaluate;
          }
        }
      }
      else if ((int)DVar1 < 0xa0a01) {
        if ((int)DVar1 < 0xa0709) {
          if (DVar1 == 0xa0405) {
            return Evaluator<2,_2,_2,_0,_5>::evaluate;
          }
          if (DVar1 == 0xa0505) {
            return Evaluator<2,_2,_2,_2,_5>::evaluate;
          }
          if (DVar1 == 0xa0609) {
            return Evaluator<2,_2,_3,_0,_9>::evaluate;
          }
        }
        else {
          if (DVar1 == 0xa0709) {
            return Evaluator<2,_2,_3,_2,_9>::evaluate;
          }
          if (DVar1 == 0xa080d) {
            return Evaluator<2,_2,_4,_0,_13>::evaluate;
          }
          if (DVar1 == 0xa090d) {
            return Evaluator<2,_2,_4,_2,_13>::evaluate;
          }
        }
      }
      else if ((int)DVar1 < 0xa0b01) {
        if (DVar1 == 0xa0a01) {
          return Evaluator<2,_2,_5,_0,_1>::evaluate;
        }
        if (DVar1 == 0xa0a02) {
          return Evaluator<2,_2,_5,_0,_2>::evaluate;
        }
        if (DVar1 == 0xa0a05) {
          return Evaluator<2,_2,_5,_0,_5>::evaluate;
        }
      }
      else {
        if (DVar1 == 0xa0b01) {
          return Evaluator<2,_2,_5,_2,_1>::evaluate;
        }
        if (DVar1 == 0xa0b02) {
          return Evaluator<2,_2,_5,_2,_2>::evaluate;
        }
        if (DVar1 == 0xa1201) {
          return Evaluator<2,_2,_9,_0,_1>::evaluate;
        }
      }
    }
    else if ((int)DVar1 < 0xc1201) {
      if ((int)DVar1 < 0xa1a0d) {
        if ((int)DVar1 < 0xa1303) {
          if (DVar1 == 0xa1203) {
            return Evaluator<2,_2,_9,_0,_3>::evaluate;
          }
          if (DVar1 == 0xa1209) {
            return Evaluator<2,_2,_9,_0,_9>::evaluate;
          }
          if (DVar1 == 0xa1301) {
            return Evaluator<2,_2,_9,_2,_1>::evaluate;
          }
        }
        else {
          if (DVar1 == 0xa1303) {
            return Evaluator<2,_2,_9,_2,_3>::evaluate;
          }
          if (DVar1 == 0xa1a01) {
            return Evaluator<2,_2,_13,_0,_1>::evaluate;
          }
          if (DVar1 == 0xa1a04) {
            return Evaluator<2,_2,_13,_0,_4>::evaluate;
          }
        }
      }
      else if ((int)DVar1 < 0xc0a01) {
        if (DVar1 == 0xa1a0d) {
          return Evaluator<2,_2,_13,_0,_13>::evaluate;
        }
        if (DVar1 == 0xa1b01) {
          return Evaluator<2,_2,_13,_2,_1>::evaluate;
        }
        if (DVar1 == 0xa1b04) {
          return Evaluator<2,_2,_13,_2,_4>::evaluate;
        }
      }
      else {
        if (DVar1 == 0xc0a01) {
          return Evaluator<3,_0,_5,_0,_1>::evaluate;
        }
        if (DVar1 == 0xc0a05) {
          return Evaluator<3,_0,_5,_0,_5>::evaluate;
        }
        if (DVar1 == 0xc0b01) {
          return Evaluator<3,_0,_5,_2,_1>::evaluate;
        }
      }
    }
    else if ((int)DVar1 < 0xe0a01) {
      if ((int)DVar1 < 0xc1a01) {
        if (DVar1 == 0xc1201) {
          return Evaluator<3,_0,_9,_0,_1>::evaluate;
        }
        if (DVar1 == 0xc1209) {
          return Evaluator<3,_0,_9,_0,_9>::evaluate;
        }
        if (DVar1 == 0xc1301) {
          return Evaluator<3,_0,_9,_2,_1>::evaluate;
        }
      }
      else {
        if (DVar1 == 0xc1a01) {
          return Evaluator<3,_0,_13,_0,_1>::evaluate;
        }
        if (DVar1 == 0xc1a0d) {
          return Evaluator<3,_0,_13,_0,_13>::evaluate;
        }
        if (DVar1 == 0xc1b01) {
          return Evaluator<3,_0,_13,_2,_1>::evaluate;
        }
      }
    }
    else if ((int)DVar1 < 0xe1201) {
      if (DVar1 == 0xe0a01) {
        return Evaluator<3,_2,_5,_0,_1>::evaluate;
      }
      if (DVar1 == 0xe0a05) {
        return Evaluator<3,_2,_5,_0,_5>::evaluate;
      }
      if (DVar1 == 0xe0b01) {
        return Evaluator<3,_2,_5,_2,_1>::evaluate;
      }
    }
    else {
      if (DVar1 == 0xe1201) {
        return Evaluator<3,_2,_9,_0,_1>::evaluate;
      }
      if (DVar1 == 0xe1209) {
        return Evaluator<3,_2,_9,_0,_9>::evaluate;
      }
      if (DVar1 == 0xe1301) {
        return Evaluator<3,_2,_9,_2,_1>::evaluate;
      }
    }
  }
  else if ((int)DVar1 < 0x2c0b05) {
    if ((int)DVar1 < 0x1c1a5e) {
      if ((int)DVar1 < 0x141a5e) {
        if ((int)DVar1 < 0x101a0d) {
          if ((int)DVar1 < 0xe1b01) {
            if (DVar1 == 0xe1a01) {
              return Evaluator<3,_2,_13,_0,_1>::evaluate;
            }
            if (DVar1 == 0xe1a0d) {
              return Evaluator<3,_2,_13,_0,_13>::evaluate;
            }
          }
          else {
            if (DVar1 == 0xe1b01) {
              return Evaluator<3,_2,_13,_2,_1>::evaluate;
            }
            if (DVar1 == 0x100a05) {
              return Evaluator<4,_0,_5,_0,_5>::evaluate;
            }
            if (DVar1 == 0x101209) {
              return Evaluator<4,_0,_9,_0,_9>::evaluate;
            }
          }
        }
        else if ((int)DVar1 < 0x121a0d) {
          if (DVar1 == 0x101a0d) {
            return Evaluator<4,_0,_13,_0,_13>::evaluate;
          }
          if (DVar1 == 0x120a05) {
            return Evaluator<4,_2,_5,_0,_5>::evaluate;
          }
          if (DVar1 == 0x121209) {
            return Evaluator<4,_2,_9,_0,_9>::evaluate;
          }
        }
        else {
          if (DVar1 == 0x121a0d) {
            return Evaluator<4,_2,_13,_0,_13>::evaluate;
          }
          if (DVar1 == 0x140a5e) {
            return Evaluator<5,_0,_5,_0,_94>::evaluate;
          }
          if (DVar1 == 0x14125e) {
            return Evaluator<5,_0,_9,_0,_94>::evaluate;
          }
        }
      }
      else if ((int)DVar1 < 0x181a5e) {
        if ((int)DVar1 < 0x161a5e) {
          if (DVar1 == 0x141a5e) {
            return Evaluator<5,_0,_13,_0,_94>::evaluate;
          }
          if (DVar1 == 0x160a5e) {
            return Evaluator<5,_2,_5,_0,_94>::evaluate;
          }
          if (DVar1 == 0x16125e) {
            return Evaluator<5,_2,_9,_0,_94>::evaluate;
          }
        }
        else {
          if (DVar1 == 0x161a5e) {
            return Evaluator<5,_2,_13,_0,_94>::evaluate;
          }
          if (DVar1 == 0x180a5e) {
            return Evaluator<6,_0,_5,_0,_94>::evaluate;
          }
          if (DVar1 == 0x18125e) {
            return Evaluator<6,_0,_9,_0,_94>::evaluate;
          }
        }
      }
      else if ((int)DVar1 < 0x1a1a5e) {
        if (DVar1 == 0x181a5e) {
          return Evaluator<6,_0,_13,_0,_94>::evaluate;
        }
        if (DVar1 == 0x1a0a5e) {
          return Evaluator<6,_2,_5,_0,_94>::evaluate;
        }
        if (DVar1 == 0x1a125e) {
          return Evaluator<6,_2,_9,_0,_94>::evaluate;
        }
      }
      else {
        if (DVar1 == 0x1a1a5e) {
          return Evaluator<6,_2,_13,_0,_94>::evaluate;
        }
        if (DVar1 == 0x1c0a5e) {
          return Evaluator<7,_0,_5,_0,_94>::evaluate;
        }
        if (DVar1 == 0x1c125e) {
          return Evaluator<7,_0,_9,_0,_94>::evaluate;
        }
      }
    }
    else if ((int)DVar1 < 0x24125e) {
      if ((int)DVar1 < 0x20125e) {
        if ((int)DVar1 < 0x1e125e) {
          if (DVar1 == 0x1c1a5e) {
            return Evaluator<7,_0,_13,_0,_94>::evaluate;
          }
          if (DVar1 == 0x1e0a5e) {
            return Evaluator<7,_2,_5,_0,_94>::evaluate;
          }
        }
        else {
          if (DVar1 == 0x1e125e) {
            return Evaluator<7,_2,_9,_0,_94>::evaluate;
          }
          if (DVar1 == 0x1e1a5e) {
            return Evaluator<7,_2,_13,_0,_94>::evaluate;
          }
          if (DVar1 == 0x200a5e) {
            return Evaluator<8,_0,_5,_0,_94>::evaluate;
          }
        }
      }
      else if ((int)DVar1 < 0x22125e) {
        if (DVar1 == 0x20125e) {
          return Evaluator<8,_0,_9,_0,_94>::evaluate;
        }
        if (DVar1 == 0x201a5e) {
          return Evaluator<8,_0,_13,_0,_94>::evaluate;
        }
        if (DVar1 == 0x220a5e) {
          return Evaluator<8,_2,_5,_0,_94>::evaluate;
        }
      }
      else {
        if (DVar1 == 0x22125e) {
          return Evaluator<8,_2,_9,_0,_94>::evaluate;
        }
        if (DVar1 == 0x221a5e) {
          return Evaluator<8,_2,_13,_0,_94>::evaluate;
        }
        if (DVar1 == 0x240a5e) {
          return Evaluator<9,_0,_5,_0,_94>::evaluate;
        }
      }
    }
    else if ((int)DVar1 < 0x28125e) {
      if ((int)DVar1 < 0x26125e) {
        if (DVar1 == 0x24125e) {
          return Evaluator<9,_0,_9,_0,_94>::evaluate;
        }
        if (DVar1 == 0x241a5e) {
          return Evaluator<9,_0,_13,_0,_94>::evaluate;
        }
        if (DVar1 == 0x260a5e) {
          return Evaluator<9,_2,_5,_0,_94>::evaluate;
        }
      }
      else {
        if (DVar1 == 0x26125e) {
          return Evaluator<9,_2,_9,_0,_94>::evaluate;
        }
        if (DVar1 == 0x261a5e) {
          return Evaluator<9,_2,_13,_0,_94>::evaluate;
        }
        if (DVar1 == 0x280a5e) {
          return Evaluator<10,_0,_5,_0,_94>::evaluate;
        }
      }
    }
    else if ((int)DVar1 < 0x2a125e) {
      if (DVar1 == 0x28125e) {
        return Evaluator<10,_0,_9,_0,_94>::evaluate;
      }
      if (DVar1 == 0x281a5e) {
        return Evaluator<10,_0,_13,_0,_94>::evaluate;
      }
      if (DVar1 == 0x2a0a5e) {
        return Evaluator<10,_2,_5,_0,_94>::evaluate;
      }
    }
    else {
      if (DVar1 == 0x2a125e) {
        return Evaluator<10,_2,_9,_0,_94>::evaluate;
      }
      if (DVar1 == 0x2a1a5e) {
        return Evaluator<10,_2,_13,_0,_94>::evaluate;
      }
      if (DVar1 == 0x2c0a05) {
        return Evaluator<11,_0,_5,_0,_5>::evaluate;
      }
    }
  }
  else if ((int)DVar1 < 0x340a05) {
    if ((int)DVar1 < 0x300a05) {
      if ((int)DVar1 < 0x2e0a05) {
        if ((int)DVar1 < 0x2c1309) {
          if (DVar1 == 0x2c0b05) {
            return Evaluator<11,_0,_5,_2,_5>::evaluate;
          }
          if (DVar1 == 0x2c1209) {
            return Evaluator<11,_0,_9,_0,_9>::evaluate;
          }
        }
        else {
          if (DVar1 == 0x2c1309) {
            return Evaluator<11,_0,_9,_2,_9>::evaluate;
          }
          if (DVar1 == 0x2c1a0d) {
            return Evaluator<11,_0,_13,_0,_13>::evaluate;
          }
          if (DVar1 == 0x2c1b0d) {
            return Evaluator<11,_0,_13,_2,_13>::evaluate;
          }
        }
      }
      else if ((int)DVar1 < 0x2e1309) {
        if (DVar1 == 0x2e0a05) {
          return Evaluator<11,_2,_5,_0,_5>::evaluate;
        }
        if (DVar1 == 0x2e0b05) {
          return Evaluator<11,_2,_5,_2,_5>::evaluate;
        }
        if (DVar1 == 0x2e1209) {
          return Evaluator<11,_2,_9,_0,_9>::evaluate;
        }
      }
      else {
        if (DVar1 == 0x2e1309) {
          return Evaluator<11,_2,_9,_2,_9>::evaluate;
        }
        if (DVar1 == 0x2e1a0d) {
          return Evaluator<11,_2,_13,_0,_13>::evaluate;
        }
        if (DVar1 == 0x2e1b0d) {
          return Evaluator<11,_2,_13,_2,_13>::evaluate;
        }
      }
    }
    else if ((int)DVar1 < 0x320a05) {
      if ((int)DVar1 < 0x301309) {
        if (DVar1 == 0x300a05) {
          return Evaluator<12,_0,_5,_0,_5>::evaluate;
        }
        if (DVar1 == 0x300b05) {
          return Evaluator<12,_0,_5,_2,_5>::evaluate;
        }
        if (DVar1 == 0x301209) {
          return Evaluator<12,_0,_9,_0,_9>::evaluate;
        }
      }
      else {
        if (DVar1 == 0x301309) {
          return Evaluator<12,_0,_9,_2,_9>::evaluate;
        }
        if (DVar1 == 0x301a0d) {
          return Evaluator<12,_0,_13,_0,_13>::evaluate;
        }
        if (DVar1 == 0x301b0d) {
          return Evaluator<12,_0,_13,_2,_13>::evaluate;
        }
      }
    }
    else if ((int)DVar1 < 0x321309) {
      if (DVar1 == 0x320a05) {
        return Evaluator<12,_2,_5,_0,_5>::evaluate;
      }
      if (DVar1 == 0x320b05) {
        return Evaluator<12,_2,_5,_2,_5>::evaluate;
      }
      if (DVar1 == 0x321209) {
        return Evaluator<12,_2,_9,_0,_9>::evaluate;
      }
    }
    else {
      if (DVar1 == 0x321309) {
        return Evaluator<12,_2,_9,_2,_9>::evaluate;
      }
      if (DVar1 == 0x321a0d) {
        return Evaluator<12,_2,_13,_0,_13>::evaluate;
      }
      if (DVar1 == 0x321b0d) {
        return Evaluator<12,_2,_13,_2,_13>::evaluate;
      }
    }
  }
  else if ((int)DVar1 < 0x380a05) {
    if ((int)DVar1 < 0x360a05) {
      if ((int)DVar1 < 0x341309) {
        if (DVar1 == 0x340a05) {
          return Evaluator<13,_0,_5,_0,_5>::evaluate;
        }
        if (DVar1 == 0x340b05) {
          return Evaluator<13,_0,_5,_2,_5>::evaluate;
        }
        if (DVar1 == 0x341209) {
          return Evaluator<13,_0,_9,_0,_9>::evaluate;
        }
      }
      else {
        if (DVar1 == 0x341309) {
          return Evaluator<13,_0,_9,_2,_9>::evaluate;
        }
        if (DVar1 == 0x341a0d) {
          return Evaluator<13,_0,_13,_0,_13>::evaluate;
        }
        if (DVar1 == 0x341b0d) {
          return Evaluator<13,_0,_13,_2,_13>::evaluate;
        }
      }
    }
    else if ((int)DVar1 < 0x361309) {
      if (DVar1 == 0x360a05) {
        return Evaluator<13,_2,_5,_0,_5>::evaluate;
      }
      if (DVar1 == 0x360b05) {
        return Evaluator<13,_2,_5,_2,_5>::evaluate;
      }
      if (DVar1 == 0x361209) {
        return Evaluator<13,_2,_9,_0,_9>::evaluate;
      }
    }
    else {
      if (DVar1 == 0x361309) {
        return Evaluator<13,_2,_9,_2,_9>::evaluate;
      }
      if (DVar1 == 0x361a0d) {
        return Evaluator<13,_2,_13,_0,_13>::evaluate;
      }
      if (DVar1 == 0x361b0d) {
        return Evaluator<13,_2,_13,_2,_13>::evaluate;
      }
    }
  }
  else if ((int)DVar1 < 0x3a0a05) {
    if ((int)DVar1 < 0x381309) {
      if (DVar1 == 0x380a05) {
        return Evaluator<14,_0,_5,_0,_5>::evaluate;
      }
      if (DVar1 == 0x380b05) {
        return Evaluator<14,_0,_5,_2,_5>::evaluate;
      }
      if (DVar1 == 0x381209) {
        return Evaluator<14,_0,_9,_0,_9>::evaluate;
      }
    }
    else {
      if (DVar1 == 0x381309) {
        return Evaluator<14,_0,_9,_2,_9>::evaluate;
      }
      if (DVar1 == 0x381a0d) {
        return Evaluator<14,_0,_13,_0,_13>::evaluate;
      }
      if (DVar1 == 0x381b0d) {
        return Evaluator<14,_0,_13,_2,_13>::evaluate;
      }
    }
  }
  else if ((int)DVar1 < 0x3a1309) {
    if (DVar1 == 0x3a0a05) {
      return Evaluator<14,_2,_5,_0,_5>::evaluate;
    }
    if (DVar1 == 0x3a0b05) {
      return Evaluator<14,_2,_5,_2,_5>::evaluate;
    }
    if (DVar1 == 0x3a1209) {
      return Evaluator<14,_2,_9,_0,_9>::evaluate;
    }
  }
  else {
    if (DVar1 == 0x3a1309) {
      return Evaluator<14,_2,_9,_2,_9>::evaluate;
    }
    if (DVar1 == 0x3a1a0d) {
      return Evaluator<14,_2,_13,_0,_13>::evaluate;
    }
    if (DVar1 == 0x3a1b0d) {
      return Evaluator<14,_2,_13,_2,_13>::evaluate;
    }
  }
  return (ShaderEvalFunc)0x0;
}

Assistant:

ShaderEvalFunc getEvalFunc (const ShaderInput& in0, const ShaderInput& in1, MatrixOp op)
{
	DE_STATIC_ASSERT(TYPE_LAST		<= (1<<7));
	DE_STATIC_ASSERT(OP_LAST		<= (1<<4));
	DE_STATIC_ASSERT(INPUTTYPE_LAST	<= (1<<2));

#define PACK_EVAL_CASE(OP, IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE)	(((OP) << 18) | ((IN0TYPE) << 16) | ((IN0DATATYPE) << 9) | ((IN1TYPE) << 7) | (IN1DATATYPE))

#define MAKE_EVAL_CASE(OP, IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE)		\
	case PACK_EVAL_CASE(OP, IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE):	\
		return Evaluator<OP, IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE>::evaluate

#define SCALAR_OPS(IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE)	\
	MAKE_EVAL_CASE(OP_ADD,		IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_SUB,		IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_MUL,		IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_DIV,		IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE)

#define ALL_OPS(IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE)	\
	MAKE_EVAL_CASE(OP_ADD,			IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_SUB,			IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_MUL,			IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_DIV,			IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_COMP_MUL,		IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE);

#define MUL_OP(IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE)	\
	MAKE_EVAL_CASE(OP_MUL, IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE)

#define MAKE_MAT_SCALAR_VEC_CASES(OP, TYPE0, TYPE1)				\
	OP(INPUTTYPE_CONST,		TYPE0, INPUTTYPE_CONST,		TYPE1);	\
	OP(INPUTTYPE_DYNAMIC,	TYPE0, INPUTTYPE_CONST,		TYPE1);	\
	OP(INPUTTYPE_CONST,		TYPE0, INPUTTYPE_DYNAMIC,	TYPE1);	\
	OP(INPUTTYPE_DYNAMIC,	TYPE0, INPUTTYPE_DYNAMIC,	TYPE1)

#define MAKE_MAT_MAT_CASES(OP, MATTYPE)								\
	OP(INPUTTYPE_CONST,		MATTYPE, INPUTTYPE_CONST,	MATTYPE);	\
	OP(INPUTTYPE_DYNAMIC,	MATTYPE, INPUTTYPE_CONST,	MATTYPE)

#define UNARY_OP(IN0TYPE, IN0DATATYPE)														\
	MAKE_EVAL_CASE(OP_UNARY_PLUS,		IN0TYPE, IN0DATATYPE, INPUTTYPE_CONST, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_NEGATION,			IN0TYPE, IN0DATATYPE, INPUTTYPE_CONST, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_PRE_INCREMENT,	IN0TYPE, IN0DATATYPE, INPUTTYPE_CONST, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_PRE_DECREMENT,	IN0TYPE, IN0DATATYPE, INPUTTYPE_CONST, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_POST_INCREMENT,	IN0TYPE, IN0DATATYPE, INPUTTYPE_CONST, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_POST_DECREMENT,	IN0TYPE, IN0DATATYPE, INPUTTYPE_CONST, TYPE_LAST)

#define MAKE_UNARY_CASES(OP, MATTYPE)	\
	OP(INPUTTYPE_CONST,		MATTYPE);	\
	OP(INPUTTYPE_DYNAMIC,	MATTYPE)

#define ASSIGN_OP(IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE)							\
	MAKE_EVAL_CASE(OP_ADD_INTO,			IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_SUBTRACT_FROM,	IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_MULTIPLY_INTO,	IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_DIVIDE_INTO,		IN0TYPE, IN0DATATYPE, IN1TYPE, IN1DATATYPE)

#define MAKE_ASSIGNMENT_CASES(OP, MATTYPE)						\
	OP(INPUTTYPE_CONST,		MATTYPE, INPUTTYPE_CONST,	MATTYPE);	\
	OP(INPUTTYPE_DYNAMIC,	MATTYPE, INPUTTYPE_CONST,	MATTYPE);	\
	OP(INPUTTYPE_CONST,		MATTYPE, INPUTTYPE_DYNAMIC,	MATTYPE);	\
	OP(INPUTTYPE_DYNAMIC,	MATTYPE, INPUTTYPE_DYNAMIC,	MATTYPE)

	// \note At the moment there is no difference between uniform and const inputs. This saves binary size.
	InputType in0Type = in0.inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_DYNAMIC : INPUTTYPE_CONST;
	InputType in1Type = in1.inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_DYNAMIC : INPUTTYPE_CONST;

	switch (PACK_EVAL_CASE(op, in0Type, in0.dataType, in1Type, in1.dataType))
	{
		// Matrix-scalar.
		MAKE_MAT_SCALAR_VEC_CASES(SCALAR_OPS,	TYPE_FLOAT_MAT2, TYPE_FLOAT);
		MAKE_MAT_SCALAR_VEC_CASES(SCALAR_OPS,	TYPE_FLOAT_MAT3, TYPE_FLOAT);
		MAKE_MAT_SCALAR_VEC_CASES(SCALAR_OPS,	TYPE_FLOAT_MAT4, TYPE_FLOAT);

		// Matrix-vector.
		MAKE_MAT_SCALAR_VEC_CASES(MUL_OP,		TYPE_FLOAT_MAT2, TYPE_FLOAT_VEC2);
		MAKE_MAT_SCALAR_VEC_CASES(MUL_OP,		TYPE_FLOAT_MAT3, TYPE_FLOAT_VEC3);
		MAKE_MAT_SCALAR_VEC_CASES(MUL_OP,		TYPE_FLOAT_MAT4, TYPE_FLOAT_VEC4);

		// Vector-matrix.
		MAKE_MAT_SCALAR_VEC_CASES(MUL_OP,		TYPE_FLOAT_VEC2, TYPE_FLOAT_MAT2);
		MAKE_MAT_SCALAR_VEC_CASES(MUL_OP,		TYPE_FLOAT_VEC3, TYPE_FLOAT_MAT3);
		MAKE_MAT_SCALAR_VEC_CASES(MUL_OP,		TYPE_FLOAT_VEC4, TYPE_FLOAT_MAT4);

		// Matrix-matrix.
		MAKE_MAT_MAT_CASES(ALL_OPS,	TYPE_FLOAT_MAT2);
		MAKE_MAT_MAT_CASES(ALL_OPS,	TYPE_FLOAT_MAT3);
		MAKE_MAT_MAT_CASES(ALL_OPS,	TYPE_FLOAT_MAT4);

		// Unary matrix
		MAKE_UNARY_CASES(UNARY_OP, TYPE_FLOAT_MAT2);
		MAKE_UNARY_CASES(UNARY_OP, TYPE_FLOAT_MAT3);
		MAKE_UNARY_CASES(UNARY_OP, TYPE_FLOAT_MAT4);

		// Assignment matrix
		MAKE_ASSIGNMENT_CASES(ASSIGN_OP, TYPE_FLOAT_MAT2);
		MAKE_ASSIGNMENT_CASES(ASSIGN_OP, TYPE_FLOAT_MAT3);
		MAKE_ASSIGNMENT_CASES(ASSIGN_OP, TYPE_FLOAT_MAT4);

		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}

#undef PACK_EVAL_CASE
#undef MAKE_EVAL_CASE
#undef MUL_OP
#undef ALL_OPS
#undef MAKE_MAT_SCALAR_VEC_CASES
#undef MAKE_MAT_MAT_CASES
}